

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client>::~NullableValue
              ((NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client> *)
               ((long)pointer + 0x20));
    Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x50);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }